

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::convert_arg_for_ini
                   (string *arg,char stringQuote,char literalQuote,bool disable_multi_line)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  byte *pbVar5;
  const_reference pvVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  const_iterator cVar8;
  undefined1 in_CL;
  char in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  byte in_R8B;
  double val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  char cVar9;
  char *in_stack_fffffffffffffd98;
  allocator<char> *__n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_211 [3];
  allocator<char> local_1a9 [72];
  allocator<char> local_161;
  double *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffea8;
  allocator<char> local_b9 [72];
  allocator<char> local_71 [65];
  undefined8 local_30;
  undefined5 in_stack_ffffffffffffffe8;
  
  bVar1 = in_R8B & 1;
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17ff4b);
  if (bVar2) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffda0,(size_type)in_stack_fffffffffffffd98,
               (char)((uint)in_stack_fffffffffffffd94 >> 0x18),
               (allocator<char> *)in_stack_fffffffffffffd88);
    ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffec);
  }
  else {
    bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                              (char *)in_stack_fffffffffffffd78);
    if ((((bVar2) ||
         (bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80)
                                    ,(char *)in_stack_fffffffffffffd78), bVar2)) ||
        (bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                                   (char *)in_stack_fffffffffffffd78), bVar2)) ||
       (bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                                  (char *)in_stack_fffffffffffffd78), bVar2)) {
      ::std::__cxx11::string::string
                (in_stack_fffffffffffffdc0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    }
    else {
      iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(in_stack_fffffffffffffdb0,
                      CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                      (size_type)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      if ((iVar3 != 0) &&
         (iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(in_stack_fffffffffffffdb0,
                          CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                          (size_type)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98),
         iVar3 != 0)) {
        local_30 = 0;
        bVar2 = lexical_cast<double,_(CLI::detail::enabler)0>
                          (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
        if ((bVar2) &&
           (sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::find_first_not_of(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90
                                                )), sVar4 == 0xffffffffffffffff)) {
          ::std::__cxx11::string::string
                    (in_stack_fffffffffffffdc0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
          return in_RDI;
        }
      }
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (in_RSI);
      if (sVar4 == 1) {
        pbVar5 = (byte *)std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80)
                                   );
        cVar9 = (char)((uint)in_stack_fffffffffffffd94 >> 0x18);
        iVar3 = isprint((uint)*pbVar5);
        if (iVar3 == 0) {
          binary_escape_string
                    ((string *)
                     CONCAT17(in_DL,CONCAT16(in_CL,CONCAT15(bVar1,in_stack_ffffffffffffffe8))));
        }
        else {
          bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80)
                                    ,(char *)in_stack_fffffffffffffd78);
          if (bVar2) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffda0,(size_type)in_stack_fffffffffffffd98,cVar9,
                       (allocator<char> *)in_stack_fffffffffffffd88);
            ::std::operator+(in_stack_fffffffffffffd88,
                             (char *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
            ::std::operator+(in_stack_fffffffffffffd88,
                             (char)((uint)in_stack_fffffffffffffd84 >> 0x18));
            ::std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
            ::std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
            ::std::allocator<char>::~allocator(local_71);
          }
          else {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffda0,(size_type)in_stack_fffffffffffffd98,cVar9,
                       (allocator<char> *)in_stack_fffffffffffffd88);
            ::std::operator+(in_stack_fffffffffffffd88,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
            ::std::operator+(in_stack_fffffffffffffd88,
                             (char)((uint)in_stack_fffffffffffffd84 >> 0x18));
            ::std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
            ::std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
            ::std::allocator<char>::~allocator(local_b9);
          }
        }
      }
      else {
        pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
        if (*pvVar6 == '0') {
          pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                              (size_type)in_stack_fffffffffffffd78);
          if (*pvVar6 == 'x') {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                      (in_stack_fffffffffffffd78);
            _Var7 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)in_stack_fffffffffffffd88,
                                CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
            cVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::end(in_stack_fffffffffffffd88);
            bVar2 = ::std::
                    all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_1_>
                              (_Var7._M_current,cVar8._M_current);
            if (bVar2) {
              ::std::__cxx11::string::string
                        (in_stack_fffffffffffffdc0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
              return in_RDI;
            }
          }
          else {
            pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                                  (size_type)in_stack_fffffffffffffd78);
            if (*pvVar6 == 'o') {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                        (in_stack_fffffffffffffd78);
              _Var7 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)in_stack_fffffffffffffd88,
                                  CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
              cVar8 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                (in_stack_fffffffffffffd88);
              bVar2 = ::std::
                      all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_2_>
                                (_Var7._M_current,cVar8._M_current);
              if (bVar2) {
                ::std::__cxx11::string::string
                          (in_stack_fffffffffffffdc0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
                return in_RDI;
              }
            }
            else {
              pvVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                                  (size_type)in_stack_fffffffffffffd78);
              if (*pvVar6 == 'b') {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                begin(in_stack_fffffffffffffd78);
                _Var7 = __gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)in_stack_fffffffffffffd88,
                                    CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
                cVar8 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                  (in_stack_fffffffffffffd88);
                bVar2 = ::std::
                        all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_3_>
                                  (_Var7._M_current,cVar8._M_current);
                if (bVar2) {
                  ::std::__cxx11::string::string
                            (in_stack_fffffffffffffdc0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
                  return in_RDI;
                }
              }
            }
          }
        }
        bVar2 = is_printable((string *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90)
                            );
        cVar9 = (char)((uint)in_stack_fffffffffffffd94 >> 0x18);
        if (bVar2) {
          bVar2 = has_escapable_character((string *)0x180572);
          if (bVar2) {
            sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::size(in_RSI);
            if ((sVar4 < 0x65) || ((bVar1 & 1) != 0)) {
              in_DL = in_DL >> 7;
              __n = local_1a9;
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffda0,(size_type)__n,in_DL,
                         (allocator<char> *)in_stack_fffffffffffffd88);
              add_escaped_characters
                        ((string *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                               in_stack_fffffffffffffdb0);
              ::std::operator+(in_stack_fffffffffffffd88,
                               (char)((uint)in_stack_fffffffffffffd84 >> 0x18));
              ::std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
              ::std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
              ::std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
              ::std::allocator<char>::~allocator(local_1a9);
            }
            else {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffdc0,
                         (char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                         (allocator<char> *)in_stack_fffffffffffffdb0);
              ::std::operator+(in_stack_fffffffffffffd88,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
              ::std::operator+(in_stack_fffffffffffffd88,
                               (char *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80)
                              );
              ::std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
              ::std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
              ::std::allocator<char>::~allocator(&local_161);
            }
          }
          else {
            iVar3 = (int)in_DL;
            __lhs = local_211;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffda0,(size_type)in_stack_fffffffffffffd98,cVar9,
                       (allocator<char> *)__lhs);
            ::std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(iVar3,in_stack_fffffffffffffd80));
            ::std::operator+(__lhs,(char)((uint)iVar3 >> 0x18));
            ::std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(iVar3,in_stack_fffffffffffffd80));
            ::std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(iVar3,in_stack_fffffffffffffd80));
            ::std::allocator<char>::~allocator((allocator<char> *)local_211);
          }
        }
        else {
          binary_escape_string
                    ((string *)
                     CONCAT17(in_DL,CONCAT16(in_CL,CONCAT15(bVar1,in_stack_ffffffffffffffe8))));
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string
convert_arg_for_ini(const std::string &arg, char stringQuote, char literalQuote, bool disable_multi_line) {
    if(arg.empty()) {
        return std::string(2, stringQuote);
    }
    // some specifically supported strings
    if(arg == "true" || arg == "false" || arg == "nan" || arg == "inf") {
        return arg;
    }
    // floating point conversion can convert some hex codes, but don't try that here
    if(arg.compare(0, 2, "0x") != 0 && arg.compare(0, 2, "0X") != 0) {
        using CLI::detail::lexical_cast;
        double val = 0.0;
        if(lexical_cast(arg, val)) {
            if(arg.find_first_not_of("0123456789.-+eE") == std::string::npos) {
                return arg;
            }
        }
    }
    // just quote a single non numeric character
    if(arg.size() == 1) {
        if(isprint(static_cast<unsigned char>(arg.front())) == 0) {
            return binary_escape_string(arg);
        }
        if(arg == "'") {
            return std::string(1, stringQuote) + "'" + stringQuote;
        }
        return std::string(1, literalQuote) + arg + literalQuote;
    }
    // handle hex, binary or octal arguments
    if(arg.front() == '0') {
        if(arg[1] == 'x') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) {
                   return (x >= '0' && x <= '9') || (x >= 'A' && x <= 'F') || (x >= 'a' && x <= 'f');
               })) {
                return arg;
            }
        } else if(arg[1] == 'o') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x >= '0' && x <= '7'); })) {
                return arg;
            }
        } else if(arg[1] == 'b') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x == '0' || x == '1'); })) {
                return arg;
            }
        }
    }
    if(!is_printable(arg)) {
        return binary_escape_string(arg);
    }
    if(detail::has_escapable_character(arg)) {
        if(arg.size() > 100 && !disable_multi_line) {
            return std::string(multiline_literal_quote) + arg + multiline_literal_quote;
        }
        return std::string(1, stringQuote) + detail::add_escaped_characters(arg) + stringQuote;
    }
    return std::string(1, stringQuote) + arg + stringQuote;
}